

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O1

uint aom_highbd_10_obmc_variance4x4_sse4_1
               (uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  puVar5 = (undefined8 *)((long)pre * 2);
  uVar4 = 0xfffffffffffffffc;
  auVar9 = pmovsxwd(in_XMM2,0x800080008000800);
  auVar7 = (undefined1  [16])0x0;
  auVar8 = (undefined1  [16])0x0;
  do {
    auVar10 = pmovzxwd(in_XMM3,*puVar5);
    piVar1 = wsrc + uVar4 + 4;
    auVar10 = pmaddwd(auVar10,*(undefined1 (*) [16])(mask + uVar4 + 4));
    iVar12 = *piVar1 - auVar10._0_4_;
    iVar13 = piVar1[1] - auVar10._4_4_;
    iVar14 = piVar1[2] - auVar10._8_4_;
    iVar15 = piVar1[3] - auVar10._12_4_;
    auVar11._0_4_ = (iVar12 >> 0x1f) + iVar12 + auVar9._0_4_ >> 0xc;
    auVar11._4_4_ = (iVar13 >> 0x1f) + iVar13 + auVar9._4_4_ >> 0xc;
    auVar11._8_4_ = (iVar14 >> 0x1f) + iVar14 + auVar9._8_4_ >> 0xc;
    auVar11._12_4_ = (iVar15 >> 0x1f) + iVar15 + auVar9._12_4_ >> 0xc;
    auVar6._0_4_ = auVar8._0_4_ + auVar11._0_4_;
    auVar6._4_4_ = auVar8._4_4_ + auVar11._4_4_;
    auVar6._8_4_ = auVar8._8_4_ + auVar11._8_4_;
    auVar6._12_4_ = auVar8._12_4_ + auVar11._12_4_;
    in_XMM3 = pmulld(auVar11,auVar11);
    auVar10._0_4_ = auVar7._0_4_ + in_XMM3._0_4_;
    auVar10._4_4_ = auVar7._4_4_ + in_XMM3._4_4_;
    auVar10._8_4_ = auVar7._8_4_ + in_XMM3._8_4_;
    auVar10._12_4_ = auVar7._12_4_ + in_XMM3._12_4_;
    uVar4 = uVar4 + 4;
    puVar5 = (undefined8 *)((long)puVar5 + (long)(pre_stride + -4) * 2 + 8);
    auVar7 = auVar10;
    auVar8 = auVar6;
  } while (uVar4 < 0xc);
  auVar7 = phaddd(auVar6,auVar6);
  auVar8 = phaddd(auVar7,auVar7);
  auVar7 = phaddd(auVar10,auVar10);
  auVar7 = phaddd(auVar7,auVar7);
  uVar4 = (long)auVar7._0_4_ + 8U >> 4;
  *sse = (uint)uVar4;
  lVar3 = (long)auVar8._0_4_ * 0x40000000 + 0x80000000 >> 0x20;
  lVar3 = (uVar4 & 0xffffffff) - ((ulong)(lVar3 * lVar3) >> 4);
  uVar2 = (uint)lVar3;
  if (lVar3 < 0) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static inline void hbd_obmc_variance_w4(
    const uint8_t *pre8, const int pre_stride, const int32_t *wsrc,
    const int32_t *mask, uint64_t *const sse, int64_t *const sum, const int h) {
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  const int pre_step = pre_stride - 4;
  int n = 0;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();

  assert(IS_POWER_OF_TWO(h));

  do {
    const __m128i v_p_w = xx_loadl_64(pre + n);
    const __m128i v_m_d = xx_load_128(mask + n);
    const __m128i v_w_d = xx_load_128(wsrc + n);

    const __m128i v_p_d = _mm_cvtepu16_epi32(v_p_w);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm_d = _mm_madd_epi16(v_p_d, v_m_d);

    const __m128i v_diff_d = _mm_sub_epi32(v_w_d, v_pm_d);
    const __m128i v_rdiff_d = xx_roundn_epi32(v_diff_d, 12);
    const __m128i v_sqrdiff_d = _mm_mullo_epi32(v_rdiff_d, v_rdiff_d);

    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff_d);
    v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

    n += 4;

    if (n % 4 == 0) pre += pre_step;
  } while (n < 4 * h);

  *sum = xx_hsum_epi32_si32(v_sum_d);
  *sse = xx_hsum_epi32_si32(v_sse_d);
}